

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Graph::performLocalNameSearch(Graph *this,NameSearch *search,Statement *s)

{
  bool bVar1;
  ProcessorInstance *o;
  undefined1 local_28 [8];
  pool_ptr<soul::AST::ProcessorInstance> i;
  Statement *s_local;
  NameSearch *search_local;
  Graph *this_local;
  
  i.object = (ProcessorInstance *)s;
  ModuleBase::performLocalNameSearch((ModuleBase *)this,search,s);
  if ((search->findProcessorInstances & 1U) != 0) {
    IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
    findChildProcessor<soul::Identifier>((Graph *)local_28,(Identifier *)this);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)local_28);
    if (bVar1) {
      o = pool_ptr<soul::AST::ProcessorInstance>::operator*
                    ((pool_ptr<soul::AST::ProcessorInstance> *)local_28);
      Scope::NameSearch::addResult(search,&o->super_ASTObject);
    }
    pool_ptr<soul::AST::ProcessorInstance>::~pool_ptr
              ((pool_ptr<soul::AST::ProcessorInstance> *)local_28);
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* s) const override
        {
            ProcessorBase::performLocalNameSearch (search, s);

            if (search.findProcessorInstances)
                if (auto i = findChildProcessor (search.partiallyQualifiedPath.getLastPart()))
                    search.addResult (*i);
        }